

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_thread_identity.cc
# Opt level: O0

ThreadIdentity * absl::lts_20250127::synchronization_internal::NewThreadIdentity(void)

{
  void *addr;
  void *allocation;
  SpinLockHolder l;
  ThreadIdentity *identity;
  
  l.lock_ = (SpinLock *)0x0;
  base_internal::SpinLockHolder::SpinLockHolder
            ((SpinLockHolder *)&allocation,(SpinLock *)&freelist_lock);
  if (thread_identity_freelist != (SpinLock *)0x0) {
    l.lock_ = thread_identity_freelist;
    thread_identity_freelist = *(SpinLock **)(thread_identity_freelist + 0x56);
  }
  base_internal::SpinLockHolder::~SpinLockHolder((SpinLockHolder *)&allocation);
  if (l.lock_ == (SpinLock *)0x0) {
    addr = base_internal::LowLevelAlloc::Alloc(0x25f);
    l.lock_ = (SpinLock *)RoundUp((intptr_t)addr,0x100);
    OneTimeInitThreadIdentity((ThreadIdentity *)l.lock_);
  }
  ResetThreadIdentityBetweenReuse((ThreadIdentity *)l.lock_);
  return (ThreadIdentity *)l.lock_;
}

Assistant:

static base_internal::ThreadIdentity* NewThreadIdentity() {
  base_internal::ThreadIdentity* identity = nullptr;

  {
    // Re-use a previously released object if possible.
    base_internal::SpinLockHolder l(&freelist_lock);
    if (thread_identity_freelist) {
      identity = thread_identity_freelist;  // Take list-head.
      thread_identity_freelist = thread_identity_freelist->next;
    }
  }

  if (identity == nullptr) {
    // Allocate enough space to align ThreadIdentity to a multiple of
    // PerThreadSynch::kAlignment. This space is never released (it is
    // added to a freelist by ReclaimThreadIdentity instead).
    void* allocation = base_internal::LowLevelAlloc::Alloc(
        sizeof(*identity) + base_internal::PerThreadSynch::kAlignment - 1);
    // Round up the address to the required alignment.
    identity = reinterpret_cast<base_internal::ThreadIdentity*>(
        RoundUp(reinterpret_cast<intptr_t>(allocation),
                base_internal::PerThreadSynch::kAlignment));
    // Note that *identity is never constructed.
    // TODO(b/357097463): change this "one time init" to be a proper
    // constructor.
    OneTimeInitThreadIdentity(identity);
  }
  ResetThreadIdentityBetweenReuse(identity);

  return identity;
}